

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void FindActions(lemon *lemp)

{
  uint uVar1;
  e_assoc eVar2;
  symbol *psVar3;
  symbol *psVar4;
  rule *prVar5;
  rule *prVar6;
  state **ppsVar7;
  symbol *psVar8;
  action *paVar9;
  action *paVar10;
  uint uVar11;
  ulong uVar12;
  action *paVar13;
  state *psVar14;
  int iVar15;
  e_action eVar16;
  config *pcVar17;
  long lVar18;
  long lVar19;
  
  iVar15 = lemp->nstate;
  if (0 < iVar15) {
    lVar19 = 0;
    do {
      psVar14 = lemp->sorted[lVar19];
      pcVar17 = psVar14->cfp;
      if (pcVar17 != (config *)0x0) {
        do {
          if ((pcVar17->rp->nrhs == pcVar17->dot) && (iVar15 = lemp->nterminal, 0 < iVar15)) {
            lVar18 = 0;
            do {
              if (pcVar17->fws[lVar18] != '\0') {
                Action_add(&psVar14->ap,REDUCE,lemp->symbols[lVar18],(char *)pcVar17->rp);
                iVar15 = lemp->nterminal;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < iVar15);
          }
          pcVar17 = pcVar17->next;
        } while (pcVar17 != (config *)0x0);
        iVar15 = lemp->nstate;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar15);
  }
  if ((lemp->start == (char *)0x0) || (psVar8 = Symbol_find(lemp->start), psVar8 == (symbol *)0x0))
  {
    psVar8 = lemp->rule->lhs;
  }
  Action_add(&(*lemp->sorted)->ap,ACCEPT,psVar8,(char *)0x0);
  uVar11 = lemp->nstate;
  if (0 < (int)uVar11) {
    lVar19 = 0;
    do {
      psVar14 = lemp->sorted[lVar19];
      paVar9 = psVar14->ap;
      paVar9 = (action *)msort((char *)paVar9,(char **)&paVar9->next,actioncmp);
      psVar14->ap = paVar9;
      if (paVar9 != (action *)0x0) {
LAB_00104f16:
        paVar10 = paVar9;
        paVar9 = paVar10->next;
        if (paVar9 != (action *)0x0) {
          psVar8 = paVar10->sp;
          paVar13 = paVar9;
          do {
            if (paVar13->sp != psVar8) break;
            eVar16 = paVar10->type;
            iVar15 = 0;
            if (eVar16 == SHIFT) {
              eVar16 = paVar13->type;
              if (eVar16 == REDUCE) {
                psVar3 = ((paVar13->x).rp)->precsym;
                if (((psVar3 == (symbol *)0x0) || (uVar11 = psVar8->prec, (int)uVar11 < 0)) ||
                   (uVar1 = psVar3->prec, (int)uVar1 < 0)) {
LAB_0010503c:
                  paVar13->type = SRCONFLICT;
                  iVar15 = 1;
                }
                else {
                  if (uVar1 < uVar11) {
LAB_0010501b:
                    paVar13->type = RD_RESOLVED;
                  }
                  else {
                    if ((uVar1 <= uVar11) && (eVar2 = psVar8->assoc, eVar2 != LEFT)) {
                      if (eVar2 == NONE) goto LAB_0010503c;
                      if (eVar2 != RIGHT) {
                        __assert_fail("spx->prec==spy->prec && spx->assoc==NONE",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                                      ,0x457,
                                      "int resolve_conflict(struct action *, struct action *, struct symbol *)"
                                     );
                      }
                      goto LAB_0010501b;
                    }
                    paVar10->type = SH_RESOLVED;
                  }
                  iVar15 = 0;
                }
              }
              else {
                iVar15 = 0;
                if (eVar16 != SHIFT) goto LAB_00104fdf;
                paVar13->type = SSCONFLICT;
                eVar16 = paVar10->type;
                iVar15 = 1;
                if (eVar16 != SHIFT) goto LAB_00104f3f;
              }
            }
            else {
LAB_00104f3f:
              if (eVar16 == REDUCE) {
                eVar16 = paVar13->type;
                if (eVar16 == REDUCE) {
                  psVar3 = ((paVar10->x).rp)->precsym;
                  if (((psVar3 == (symbol *)0x0) ||
                      (psVar4 = ((paVar13->x).rp)->precsym, psVar4 == (symbol *)0x0)) ||
                     ((uVar11 = psVar3->prec, (int)uVar11 < 0 ||
                      ((uVar1 = psVar4->prec, (int)uVar1 < 0 || (uVar11 == uVar1)))))) {
                    paVar13->type = RRCONFLICT;
                    iVar15 = iVar15 + 1;
                  }
                  else if (uVar1 < uVar11) {
                    paVar13->type = RD_RESOLVED;
                  }
                  else if (uVar11 < uVar1) {
                    paVar10->type = RD_RESOLVED;
                  }
                }
                else {
LAB_00104fdf:
                  if (4 < eVar16 - SSCONFLICT) {
                    __assert_fail("apx->type==SH_RESOLVED || apx->type==RD_RESOLVED || apx->type==SSCONFLICT || apx->type==SRCONFLICT || apx->type==RRCONFLICT || apy->type==SH_RESOLVED || apy->type==RD_RESOLVED || apy->type==SSCONFLICT || apy->type==SRCONFLICT || apy->type==RRCONFLICT"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                                  ,0x473,
                                  "int resolve_conflict(struct action *, struct action *, struct symbol *)"
                                 );
                  }
                }
              }
              else if (4 < eVar16 - SSCONFLICT) {
                eVar16 = paVar13->type;
                goto LAB_00104fdf;
              }
            }
            lemp->nconflict = lemp->nconflict + iVar15;
            paVar13 = paVar13->next;
          } while (paVar13 != (action *)0x0);
          goto LAB_00104f16;
        }
      }
      lVar19 = lVar19 + 1;
      uVar11 = lemp->nstate;
    } while (lVar19 < (int)uVar11);
  }
  prVar5 = lemp->rule;
  for (prVar6 = prVar5; prVar6 != (rule *)0x0; prVar6 = prVar6->next) {
    prVar6->canReduce = LEMON_FALSE;
  }
  if (0 < (int)uVar11) {
    ppsVar7 = lemp->sorted;
    uVar12 = 0;
    do {
      psVar14 = ppsVar7[uVar12];
      while (psVar14 = (state *)psVar14->ap, psVar14 != (state *)0x0) {
        if (*(e_action *)&psVar14->cfp == REDUCE) {
          ((anon_union_8_2_743af1f4_for_x *)&psVar14->statenum)->rp->canReduce = LEMON_TRUE;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
  }
  for (; prVar5 != (rule *)0x0; prVar5 = prVar5->next) {
    if (prVar5->canReduce == LEMON_FALSE) {
      FindActions_cold_1();
    }
  }
  return;
}

Assistant:

void FindActions(struct lemon *lemp)
{
  int i,j;
  struct config *cfp;
  struct state *stp;
  struct symbol *sp;
  struct rule *rp;

  /* Add all of the reduce actions 
  ** A reduce action is added for each element of the followset of
  ** a configuration which has its dot at the extreme right.
  */
  for(i=0; i<lemp->nstate; i++){   /* Loop over all states */
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){  /* Loop over all configurations */
      if( cfp->rp->nrhs==cfp->dot ){        /* Is dot at extreme right? */
        for(j=0; j<lemp->nterminal; j++){
          if( SetFind(cfp->fws,j) ){
            /* Add a reduce action to the state "stp" which will reduce by the
            ** rule "cfp->rp" if the lookahead symbol is "lemp->symbols[j]" */
            Action_add(&stp->ap,REDUCE,lemp->symbols[j],(char *)cfp->rp);
          }
	}
      }
    }
  }

  /* Add the accepting token */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ) sp = lemp->rule->lhs;
  }else{
    sp = lemp->rule->lhs;
  }
  /* Add to the first state (which is always the starting state of the
  ** finite state machine) an action to ACCEPT if the lookahead is the
  ** start nonterminal.  */
  Action_add(&lemp->sorted[0]->ap,ACCEPT,sp,0);

  /* Resolve conflicts */
  for(i=0; i<lemp->nstate; i++){
    struct action *ap, *nap;
    struct state *stp;
    stp = lemp->sorted[i];
    /* assert( stp->ap ); */
    stp->ap = Action_sort(stp->ap);
    for(ap=stp->ap; ap && ap->next; ap=ap->next){
      for(nap=ap->next; nap && nap->sp==ap->sp; nap=nap->next){
         /* The two actions "ap" and "nap" have the same lookahead.
         ** Figure out which one should be used */
         lemp->nconflict += resolve_conflict(ap,nap,lemp->errsym);
      }
    }
  }

  /* Report an error for each rule that can never be reduced. */
  for(rp=lemp->rule; rp; rp=rp->next) rp->canReduce = LEMON_FALSE;
  for(i=0; i<lemp->nstate; i++){
    struct action *ap;
    for(ap=lemp->sorted[i]->ap; ap; ap=ap->next){
      if( ap->type==REDUCE ) ap->x.rp->canReduce = LEMON_TRUE;
    }
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    if( rp->canReduce ) continue;
    ErrorMsg(lemp->filename,rp->ruleline,"This rule can not be reduced.\n");
    lemp->errorcnt++;
  }
}